

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::GetterXsYRef<unsigned_long_long>,_ImPlot::TransformerLogLog>
                 *this,GetterXsYs<unsigned_long_long> *getter1,
                GetterXsYRef<unsigned_long_long> *getter2,TransformerLogLog *transformer,ImU32 col)

{
  unsigned_long_long uVar1;
  unsigned_long_long uVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  ImPlotPlot *pIVar8;
  GetterXsYRef<unsigned_long_long> *pGVar9;
  TransformerLogLog *pTVar10;
  double dVar11;
  double dVar12;
  ImPlotContext *pIVar13;
  int iVar14;
  long lVar15;
  ImVec2 IVar16;
  ImVec2 IVar17;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar7 = getter1->Count;
  iVar14 = getter2->Count;
  if (iVar7 < getter2->Count) {
    iVar14 = iVar7;
  }
  this->Prims = iVar14 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar13 = GImPlot;
  (this->P12).y = 0.0;
  lVar15 = (long)((getter1->Offset % iVar7 + iVar7) % iVar7) * (long)getter1->Stride;
  uVar1 = *(unsigned_long_long *)((long)getter1->Xs + lVar15);
  uVar2 = *(unsigned_long_long *)((long)getter1->Ys + lVar15);
  dVar11 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar3 = pIVar13->LogDenX;
  pIVar8 = pIVar13->CurrentPlot;
  dVar4 = (pIVar8->XAxis).Range.Min;
  dVar5 = (pIVar8->XAxis).Range.Max;
  dVar12 = log10((((double)CONCAT44(0x45300000,(int)(uVar2 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar2) - 4503599627370496.0)) /
                 pIVar8->YAxis[transformer->YAxis].Range.Min);
  iVar7 = transformer->YAxis;
  pIVar8 = pIVar13->CurrentPlot;
  dVar6 = pIVar8->YAxis[iVar7].Range.Min;
  IVar16.x = (float)((((double)(float)(dVar11 / dVar3) * (dVar5 - dVar4) + dVar4) -
                     (pIVar8->XAxis).Range.Min) * pIVar13->Mx +
                    (double)pIVar13->PixelRange[iVar7].Min.x);
  IVar16.y = (float)((((double)(float)(dVar12 / pIVar13->LogDenY[iVar7]) *
                       (pIVar8->YAxis[iVar7].Range.Max - dVar6) + dVar6) - dVar6) *
                     pIVar13->My[iVar7] + (double)pIVar13->PixelRange[iVar7].Min.y);
  this->P11 = IVar16;
  pIVar13 = GImPlot;
  pGVar9 = this->Getter2;
  pTVar10 = this->Transformer;
  iVar7 = pGVar9->Count;
  uVar1 = *(unsigned_long_long *)
           ((long)pGVar9->Xs +
           (long)((pGVar9->Offset % iVar7 + iVar7) % iVar7) * (long)pGVar9->Stride);
  dVar3 = pGVar9->YRef;
  dVar11 = log10((((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) /
                 (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar4 = pIVar13->LogDenX;
  pIVar8 = pIVar13->CurrentPlot;
  dVar5 = (pIVar8->XAxis).Range.Min;
  dVar6 = (pIVar8->XAxis).Range.Max;
  dVar12 = log10(dVar3 / pIVar8->YAxis[pTVar10->YAxis].Range.Min);
  iVar7 = pTVar10->YAxis;
  pIVar8 = pIVar13->CurrentPlot;
  dVar3 = pIVar8->YAxis[iVar7].Range.Min;
  IVar17.x = (float)((((double)(float)(dVar11 / dVar4) * (dVar6 - dVar5) + dVar5) -
                     (pIVar8->XAxis).Range.Min) * pIVar13->Mx +
                    (double)pIVar13->PixelRange[iVar7].Min.x);
  IVar17.y = (float)((((double)(float)(dVar12 / pIVar13->LogDenY[iVar7]) *
                       (pIVar8->YAxis[iVar7].Range.Max - dVar3) + dVar3) - dVar3) *
                     pIVar13->My[iVar7] + (double)pIVar13->PixelRange[iVar7].Min.y);
  this->P12 = IVar17;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }